

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void bench_ellswift_xdh(void *arg,int iters)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar2 = _secp256k1_ellswift_xdh_hash_function_bip324;
  lVar1 = (long)arg + 0x4008;
  uVar5 = 0;
  if (iters < 1) {
    iters = 0;
  }
  lVar4 = (long)arg + 0x4018;
  uVar6 = 0x10;
  lVar7 = lVar1;
  do {
    if (iters == (uint)uVar5) {
      return;
    }
    iVar3 = secp256k1_ellswift_xdh
                      (*arg,(uVar5 / 0x21) * -0x21 + lVar7,lVar1,lVar1,
                       (uVar6 / 0x21) * -0x21 + lVar4,(uint)uVar5 & 1,uVar2,0);
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 1;
    lVar4 = lVar4 + 1;
    uVar6 = uVar6 + 1;
  } while (iVar3 == 1);
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ellswift/bench_impl.h"
          ,0x57,
          "test condition failed: secp256k1_ellswift_xdh(data->ctx, data->rnd64 + (i % 33), data->rnd64, data->rnd64, data->rnd64 + ((i + 16) % 33), party, secp256k1_ellswift_xdh_hash_function_bip324, NULL) == 1"
         );
  abort();
}

Assistant:

static void bench_ellswift_xdh(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        int party = i & 1;
        CHECK(secp256k1_ellswift_xdh(data->ctx,
                                     data->rnd64 + (i % 33),
                                     data->rnd64,
                                     data->rnd64,
                                     data->rnd64 + ((i + 16) % 33),
                                     party,
                                     secp256k1_ellswift_xdh_hash_function_bip324,
                                     NULL) == 1);
    }
}